

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TryTable * __thiscall
wasm::Builder::makeTryTable
          (Builder *this,Expression *body,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchDests,
          vector<bool,_std::allocator<bool>_> *catchRefs,optional<wasm::Type> type)

{
  TryTable *this_00;
  optional<wasm::Type> type_;
  TryTable *ret;
  vector<bool,_std::allocator<bool>_> *catchRefs_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *catchDests_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags_local;
  Expression *body_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::TryTable>(&this->wasm->allocator);
  this_00->body = body;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->catchTags,catchTags);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->catchDests,catchDests)
  ;
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&this_00->catchRefs,catchRefs);
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  TryTable::finalize(this_00,type_,this->wasm);
  return this_00;
}

Assistant:

TryTable* makeTryTable(Expression* body,
                         const std::vector<Name>& catchTags,
                         const std::vector<Name>& catchDests,
                         const std::vector<bool>& catchRefs,
                         std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<TryTable>();
    ret->body = body;
    ret->catchTags.set(catchTags);
    ret->catchDests.set(catchDests);
    ret->catchRefs.set(catchRefs);
    ret->finalize(type, &wasm);
    return ret;
  }